

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O2

void __thiscall Win32MakefileGenerator::processVars(Win32MakefileGenerator *this)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  QArrayDataPointer<ProString> *pQVar4;
  QArrayDataPointer<ProString> *pQVar5;
  QList<ProString> *pQVar6;
  QList<ProString> *pQVar7;
  ProStringList *pPVar8;
  pointer pQVar9;
  iterator this_00;
  iterator iVar10;
  char *pcVar11;
  ProString *this_01;
  QMakeProject *pQVar12;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_e0;
  ProString local_c8;
  ProString local_98;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar12 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_98,"TEMPLATE");
  QMakeEvaluator::first(&local_68,&pQVar12->super_QMakeEvaluator,(ProKey *)&local_98);
  bVar2 = ProString::endsWith(&local_68,"aux",CaseSensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  if (bVar2) goto LAB_001d9096;
  pQVar12 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"TARGET");
  pQVar4 = (QArrayDataPointer<ProString> *)
           QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68);
  pQVar12 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_98,"QMAKE_ORIG_TARGET");
  pQVar5 = (QArrayDataPointer<ProString> *)
           QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_98);
  QArrayDataPointer<ProString>::operator=(pQVar5,pQVar4);
  pQVar12 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_c8,"PRL_TARGET");
  pQVar4 = (QArrayDataPointer<ProString> *)
           QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_c8);
  QArrayDataPointer<ProString>::operator=(pQVar4,pQVar5);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  pQVar12 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_PROJECT_NAME");
  bVar2 = QMakeProject::isEmpty(pQVar12,(ProKey *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if (bVar2) {
    pQVar12 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_ORIG_TARGET");
    pQVar4 = (QArrayDataPointer<ProString> *)
             QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68);
    pQVar12 = (this->super_MakefileGenerator).project;
    pcVar11 = "QMAKE_PROJECT_NAME";
LAB_001d889e:
    ProKey::ProKey((ProKey *)&local_98,pcVar11);
    pQVar5 = (QArrayDataPointer<ProString> *)
             QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_98);
    QArrayDataPointer<ProString>::operator=(pQVar5,pQVar4);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  }
  else {
    pQVar12 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_98,"TEMPLATE");
    QMakeEvaluator::first(&local_68,&pQVar12->super_QMakeEvaluator,(ProKey *)&local_98);
    bVar2 = ProString::startsWith(&local_68,"vc",CaseSensitive);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    if (bVar2) {
      pQVar12 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_68,"QMAKE_PROJECT_NAME");
      pQVar4 = (QArrayDataPointer<ProString> *)
               QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68);
      pQVar12 = (this->super_MakefileGenerator).project;
      pcVar11 = "MAKEFILE";
      goto LAB_001d889e;
    }
  }
  pQVar12 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_INCDIR_POST");
  pQVar6 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68)->
            super_QList<ProString>;
  pQVar12 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_98,"QMAKE_INCDIR");
  pQVar7 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_98)->
            super_QList<ProString>;
  QList<ProString>::append(pQVar7,pQVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  pQVar12 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_LIBDIR_POST");
  pQVar6 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68)->
            super_QList<ProString>;
  pQVar12 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_98,"QMAKE_LIBDIR");
  pQVar7 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_98)->
            super_QList<ProString>;
  QList<ProString>::append(pQVar7,pQVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  pQVar12 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_INCDIR");
  pPVar8 = QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68);
  lVar1 = (pPVar8->super_QList<ProString>).d.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if (lVar1 != 0) {
    pQVar12 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_INCDIR");
    pQVar6 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68)->
              super_QList<ProString>;
    pQVar12 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_98,"INCLUDEPATH");
    pQVar7 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_98)->
              super_QList<ProString>;
    QList<ProString>::append(pQVar7,pQVar6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  }
  pQVar12 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"VERSION");
  pPVar8 = QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68);
  lVar1 = (pPVar8->super_QList<ProString>).d.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if (lVar1 != 0) {
    local_c8.m_string.d.size = 0xaaaaaaaaaaaaaaaa;
    local_c8.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_c8.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    pQVar12 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_98,"VERSION");
    QMakeEvaluator::first(&local_68,&pQVar12->super_QMakeEvaluator,(ProKey *)&local_98);
    ProString::toQString((QString *)&local_e0,&local_68);
    QString::split(&local_c8,&local_e0,0x2e,0,1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    if (local_c8.m_string.d.size != 0) {
      pQVar12 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_68,"VER_MAJ");
      pQVar6 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68)->
                super_QList<ProString>;
      pQVar9 = QList<QString>::data((QList<QString> *)&local_c8);
      ProString::ProString(&local_98,pQVar9);
      QList<ProString>::emplaceBack<ProString>(pQVar6,&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      if (1 < (ulong)local_c8.m_string.d.size) {
        pQVar12 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_68,"VER_MIN");
        pQVar6 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68)->
                  super_QList<ProString>;
        pQVar9 = QList<QString>::data((QList<QString> *)&local_c8);
        ProString::ProString(&local_98,pQVar9 + 1);
        QList<ProString>::emplaceBack<ProString>(pQVar6,&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_c8);
  }
  pQVar12 = (this->super_MakefileGenerator).project;
  QString::QString(&local_c8.m_string,"skip_target_version_ext");
  bVar2 = QMakeProject::isActiveConfig(pQVar12,&local_c8.m_string,false);
  if (bVar2) {
LAB_001d8c6d:
    this_01 = &local_c8;
LAB_001d8c72:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_01);
  }
  else {
    pQVar12 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"TARGET_VERSION_EXT");
    pPVar8 = QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68);
    if ((pPVar8->super_QList<ProString>).d.size != 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      goto LAB_001d8c6d;
    }
    pQVar12 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_98,"VER_MAJ");
    pPVar8 = QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_98);
    lVar1 = (pPVar8->super_QList<ProString>).d.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
    if (lVar1 != 0) {
      pQVar12 = (this->super_MakefileGenerator).project;
      this_01 = &local_68;
      ProKey::ProKey((ProKey *)this_01,"TARGET_VERSION_EXT");
      pQVar6 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)this_01)->
                super_QList<ProString>;
      pQVar12 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_c8,"VER_MAJ");
      QMakeEvaluator::first(&local_98,&pQVar12->super_QMakeEvaluator,(ProKey *)&local_c8);
      QList<ProString>::emplaceBack<ProString>(pQVar6,&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
      goto LAB_001d8c72;
    }
  }
  fixTargetExt(this);
  processRcFileVar(this);
  local_c8.m_string.d.d = (Data *)0x0;
  local_c8.m_string.d.ptr = (char16_t *)0x0;
  local_c8.m_string.d.size = 0;
  pQVar12 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_LIBDIR");
  pQVar6 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68)->
            super_QList<ProString>;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  this_00 = QList<ProString>::begin(pQVar6);
  for (; iVar10 = QList<ProString>::end(pQVar6), this_00.i != iVar10.i; this_00.i = this_00.i + 1) {
    local_98.m_string.d.size = -0x5555555555555556;
    local_98.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_98.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    ProString::toQString(&local_98.m_string,this_00.i);
    if (local_98.m_string.d.size != 0) {
      cVar3 = QString::endsWith((QChar)(char16_t)&local_98,0x5c);
      if (cVar3 != '\0') {
        QString::chop((longlong)&local_98);
      }
      local_e0.d = (Data *)QtPrivate::lengthHelperPointer<char>("-L");
      local_e0.ptr = L"-L";
      local_e0.size = (qsizetype)&local_98;
      ProString::ProString<QLatin1String,QString&>
                (&local_68,(QStringBuilder<QLatin1String,_QString_&> *)&local_e0);
      QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_c8,&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  }
  pQVar12 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"LIBS");
  pQVar4 = (QArrayDataPointer<ProString> *)
           QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  operator+((ProStringList *)&local_68,(ProStringList *)&local_c8,(ProStringList *)pQVar4);
  QArrayDataPointer<ProString>::operator=(pQVar4,(QArrayDataPointer<ProString> *)&local_68);
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_68);
  pQVar12 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_68,"TEMPLATE");
  pPVar8 = QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68);
  bVar2 = ProStringList::contains(pPVar8,"app",CaseSensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  pQVar12 = (this->super_MakefileGenerator).project;
  if (bVar2) {
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_CFLAGS_APP");
    pQVar6 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68)->
              super_QList<ProString>;
    pQVar12 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_98,"QMAKE_CFLAGS");
    pQVar7 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_98)->
              super_QList<ProString>;
    QList<ProString>::append(pQVar7,pQVar6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    pQVar12 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_68,"QMAKE_CXXFLAGS_APP");
    pQVar6 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68)->
              super_QList<ProString>;
    pQVar12 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_98,"QMAKE_CXXFLAGS");
    pQVar7 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_98)->
              super_QList<ProString>;
    QList<ProString>::append(pQVar7,pQVar6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    pQVar12 = (this->super_MakefileGenerator).project;
    pcVar11 = "QMAKE_LFLAGS_APP";
LAB_001d8f1e:
    ProKey::ProKey((ProKey *)&local_68,pcVar11);
    pQVar6 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68)->
              super_QList<ProString>;
    pQVar12 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_98,"QMAKE_LFLAGS");
    pQVar7 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_98)->
              super_QList<ProString>;
    QList<ProString>::append(pQVar7,pQVar6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
LAB_001d9087:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  }
  else {
    ProKey::ProKey((ProKey *)&local_68,"TEMPLATE");
    pPVar8 = QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68);
    bVar2 = ProStringList::contains(pPVar8,"lib",CaseSensitive);
    if (!bVar2) goto LAB_001d9087;
    pQVar12 = (this->super_MakefileGenerator).project;
    QString::QString(&local_98.m_string,"dll");
    bVar2 = QMakeProject::isActiveConfig(pQVar12,&local_98.m_string,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    if (bVar2) {
      pQVar12 = (this->super_MakefileGenerator).project;
      QString::QString(&local_68.m_string,"plugin");
      bVar2 = QMakeProject::isActiveConfig(pQVar12,&local_68.m_string,false);
      if (bVar2) {
        pQVar12 = (this->super_MakefileGenerator).project;
        QString::QString(&local_98.m_string,"plugin_no_share_shlib_cflags");
        bVar2 = QMakeProject::isActiveConfig(pQVar12,&local_98.m_string,false);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
        if (!bVar2) goto LAB_001d919f;
      }
      else {
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
LAB_001d919f:
        pQVar12 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_68,"QMAKE_CFLAGS_SHLIB");
        pQVar6 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68)->
                  super_QList<ProString>;
        pQVar12 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_98,"QMAKE_CFLAGS");
        pQVar7 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_98)->
                  super_QList<ProString>;
        QList<ProString>::append(pQVar7,pQVar6);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
        pQVar12 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_68,"QMAKE_CXXFLAGS_SHLIB");
        pQVar6 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68)->
                  super_QList<ProString>;
        pQVar12 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_98,"QMAKE_CXXFLAGS");
        pQVar7 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_98)->
                  super_QList<ProString>;
        QList<ProString>::append(pQVar7,pQVar6);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      }
      pQVar12 = (this->super_MakefileGenerator).project;
      QString::QString(&local_68.m_string,"plugin");
      bVar2 = QMakeProject::isActiveConfig(pQVar12,&local_68.m_string,false);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      pQVar12 = (this->super_MakefileGenerator).project;
      if (bVar2) {
        ProKey::ProKey((ProKey *)&local_68,"QMAKE_CFLAGS_PLUGIN");
        pQVar6 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68)->
                  super_QList<ProString>;
        pQVar12 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_98,"QMAKE_CFLAGS");
        pQVar7 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_98)->
                  super_QList<ProString>;
        QList<ProString>::append(pQVar7,pQVar6);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
        pQVar12 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_68,"QMAKE_CXXFLAGS_PLUGIN");
        pQVar6 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_68)->
                  super_QList<ProString>;
        pQVar12 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_98,"QMAKE_CXXFLAGS");
        pQVar7 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&local_98)->
                  super_QList<ProString>;
        QList<ProString>::append(pQVar7,pQVar6);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
        pQVar12 = (this->super_MakefileGenerator).project;
        pcVar11 = "QMAKE_LFLAGS_PLUGIN";
      }
      else {
        pcVar11 = "QMAKE_LFLAGS_SHLIB";
      }
      goto LAB_001d8f1e;
    }
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_c8);
LAB_001d9096:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Win32MakefileGenerator::processVars()
{
    if (project->first("TEMPLATE").endsWith("aux"))
        return;

    project->values("PRL_TARGET") =
            project->values("QMAKE_ORIG_TARGET") = project->values("TARGET");
    if (project->isEmpty("QMAKE_PROJECT_NAME"))
        project->values("QMAKE_PROJECT_NAME") = project->values("QMAKE_ORIG_TARGET");
    else if (project->first("TEMPLATE").startsWith("vc"))
        project->values("MAKEFILE") = project->values("QMAKE_PROJECT_NAME");

    project->values("QMAKE_INCDIR") += project->values("QMAKE_INCDIR_POST");
    project->values("QMAKE_LIBDIR") += project->values("QMAKE_LIBDIR_POST");

    if (!project->values("QMAKE_INCDIR").isEmpty())
        project->values("INCLUDEPATH") += project->values("QMAKE_INCDIR");

    if (!project->values("VERSION").isEmpty()) {
        QStringList l = project->first("VERSION").toQString().split('.');
        if (l.size() > 0)
            project->values("VER_MAJ").append(l[0]);
        if (l.size() > 1)
            project->values("VER_MIN").append(l[1]);
    }

    // TARGET_VERSION_EXT will be used to add a version number onto the target name
    if (!project->isActiveConfig("skip_target_version_ext")
        && project->values("TARGET_VERSION_EXT").isEmpty()
        && !project->values("VER_MAJ").isEmpty())
        project->values("TARGET_VERSION_EXT").append(project->first("VER_MAJ"));

    fixTargetExt();
    processRcFileVar();

    ProStringList libs;
    ProStringList &libDir = project->values("QMAKE_LIBDIR");
    for (ProStringList::Iterator libDir_it = libDir.begin(); libDir_it != libDir.end(); ++libDir_it) {
        QString lib = (*libDir_it).toQString();
        if (!lib.isEmpty()) {
            if (lib.endsWith('\\'))
                lib.chop(1);
            libs << QLatin1String("-L") + lib;
        }
    }
    ProStringList &qmklibs = project->values("LIBS");
    qmklibs = libs + qmklibs;

    if (project->values("TEMPLATE").contains("app")) {
        project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_APP");
        project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_APP");
        project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_APP");
    } else if (project->values("TEMPLATE").contains("lib") && project->isActiveConfig("dll")) {
        if(!project->isActiveConfig("plugin") || !project->isActiveConfig("plugin_no_share_shlib_cflags")) {
            project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_SHLIB");
            project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_SHLIB");
        }
        if (project->isActiveConfig("plugin")) {
            project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_PLUGIN");
            project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_PLUGIN");
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_PLUGIN");
        } else {
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_SHLIB");
        }
    }
}